

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_color nk_hsva(int h,int s,int v,int a)

{
  nk_color nVar1;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  float af;
  float vf;
  float sf;
  float hf;
  int a_local;
  int v_local;
  int s_local;
  int h_local;
  
  local_30 = h;
  if (0xfe < h) {
    local_30 = 0xff;
  }
  if (local_30 < 0) {
    local_34 = 0;
  }
  else {
    local_38 = h;
    if (0xfe < h) {
      local_38 = 0xff;
    }
    local_34 = local_38;
  }
  local_3c = s;
  if (0xfe < s) {
    local_3c = 0xff;
  }
  if (local_3c < 0) {
    local_40 = 0;
  }
  else {
    local_44 = s;
    if (0xfe < s) {
      local_44 = 0xff;
    }
    local_40 = local_44;
  }
  local_48 = v;
  if (0xfe < v) {
    local_48 = 0xff;
  }
  if (local_48 < 0) {
    local_4c = 0;
  }
  else {
    local_50 = v;
    if (0xfe < v) {
      local_50 = 0xff;
    }
    local_4c = local_50;
  }
  local_54 = a;
  if (0xfe < a) {
    local_54 = 0xff;
  }
  if (local_54 < 0) {
    local_58 = 0;
  }
  else {
    local_5c = a;
    if (0xfe < a) {
      local_5c = 0xff;
    }
    local_58 = local_5c;
  }
  nVar1 = nk_hsva_f((float)local_34 / 255.0,(float)local_40 / 255.0,(float)local_4c / 255.0,
                    (float)local_58 / 255.0);
  return nVar1;
}

Assistant:

NK_API struct nk_color
nk_hsva(int h, int s, int v, int a)
{
    float hf = ((float)NK_CLAMP(0, h, 255)) / 255.0f;
    float sf = ((float)NK_CLAMP(0, s, 255)) / 255.0f;
    float vf = ((float)NK_CLAMP(0, v, 255)) / 255.0f;
    float af = ((float)NK_CLAMP(0, a, 255)) / 255.0f;
    return nk_hsva_f(hf, sf, vf, af);
}